

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O3

void __thiscall
slang::analysis::AnalysisScopeVisitor::checkUnused
          (AnalysisScopeVisitor *this,Symbol *symbol,DiagCode code)

{
  pair<bool,_bool> pVar1;
  
  if (((((this->manager->options).flags.m_bits & 1) != 0) &&
      (symbol->originatingSyntax != (SyntaxNode *)0x0)) && ((symbol->name)._M_len != 0)) {
    pVar1 = ast::Compilation::isReferenced
                      (this->result->scope->compilation,symbol->originatingSyntax);
    if (((ushort)pVar1 & 1) == 0) {
      addDiag(this,symbol,code);
      return;
    }
  }
  return;
}

Assistant:

void checkUnused(const Symbol& symbol, DiagCode code) {
        if (!manager.hasFlag(AnalysisFlags::CheckUnused))
            return;

        auto syntax = symbol.getSyntax();
        if (!syntax || symbol.name.empty())
            return;

        auto [used, _] = isReferenced(*syntax);
        if (!used)
            addDiag(symbol, code);
    }